

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O2

ostream * spvtools::utils::operator<<
                    (ostream *os,
                    HexFloat<spvtools::utils::FloatProxy<double>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>_>_>
                    *value)

{
  undefined4 uVar1;
  ulong uVar2;
  ostream oVar3;
  long lVar4;
  ostream *poVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  long lVar10;
  
  uVar6 = (value->value_).data_;
  pcVar9 = "-";
  if (-1 < (long)uVar6) {
    pcVar9 = "";
  }
  uVar7 = uVar6 & 0xfffffffffffff;
  uVar6 = (ulong)((uint)(uVar6 >> 0x34) & 0x7ff);
  lVar10 = 0;
  if (uVar6 != 0 || uVar7 != 0) {
    lVar10 = uVar6 - 0x3ff;
  }
  uVar8 = uVar7;
  if ((uVar6 != 0 || uVar7 != 0) && uVar6 == 0) {
    while (uVar2 = uVar8 >> 0x33, uVar8 = uVar8 * 2, (uVar2 & 1) == 0) {
      lVar10 = lVar10 + -1;
    }
    uVar8 = uVar8 & 0xffffffffffffe;
  }
  lVar4 = 0xd;
  for (; (lVar4 != 0 && ((uVar8 & 0xf) == 0)); uVar8 = uVar8 >> 4) {
    lVar4 = lVar4 + -1;
  }
  uVar1 = *(undefined4 *)(os + *(long *)(*(long *)os + -0x18) + 0x18);
  oVar3 = (ostream)std::ios::fill();
  poVar5 = std::operator<<(os,pcVar9);
  poVar5 = std::operator<<(poVar5,"0x");
  std::operator<<(poVar5,'1' - (uVar6 == 0 && uVar7 == 0));
  if (lVar4 != 0) {
    poVar5 = std::operator<<(os,".");
    *(long *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = lVar4;
    poVar5 = std::operator<<(poVar5,0x30);
    *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
         *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  }
  poVar5 = std::operator<<(os,"p");
  *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
       *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
  pcVar9 = "";
  if (-1 < lVar10) {
    pcVar9 = "+";
  }
  poVar5 = std::operator<<(poVar5,pcVar9);
  std::ostream::_M_insert<long>((long)poVar5);
  lVar10 = *(long *)os;
  *(undefined4 *)(os + *(long *)(lVar10 + -0x18) + 0x18) = uVar1;
  lVar10 = *(long *)(lVar10 + -0x18);
  std::ios::fill();
  os[lVar10 + 0xe0] = oVar3;
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const HexFloat<T, Traits>& value) {
  using HF = HexFloat<T, Traits>;
  using uint_type = typename HF::uint_type;
  using int_type = typename HF::int_type;

  static_assert(HF::num_used_bits != 0,
                "num_used_bits must be non-zero for a valid float");
  static_assert(HF::num_exponent_bits != 0,
                "num_exponent_bits must be non-zero for a valid float");
  static_assert(HF::num_fraction_bits != 0,
                "num_fractin_bits must be non-zero for a valid float");

  const uint_type bits = value.value().data();
  const char* const sign = (bits & HF::sign_mask) ? "-" : "";
  const uint_type exponent = static_cast<uint_type>(
      (bits & HF::exponent_mask) >> HF::num_fraction_bits);

  uint_type fraction = static_cast<uint_type>((bits & HF::fraction_encode_mask)
                                              << HF::num_overflow_bits);

  const bool is_zero = exponent == 0 && fraction == 0;
  const bool is_denorm = exponent == 0 && !is_zero;

  // exponent contains the biased exponent we have to convert it back into
  // the normal range.
  int_type int_exponent = static_cast<int_type>(exponent - HF::exponent_bias);
  // If the number is all zeros, then we actually have to NOT shift the
  // exponent.
  int_exponent = is_zero ? 0 : int_exponent;

  // If we are denorm, then start shifting, and decreasing the exponent until
  // our leading bit is 1.

  if (is_denorm) {
    while ((fraction & HF::fraction_top_bit) == 0) {
      fraction = static_cast<uint_type>(fraction << 1);
      int_exponent = static_cast<int_type>(int_exponent - 1);
    }
    // Since this is denormalized, we have to consume the leading 1 since it
    // will end up being implicit.
    fraction = static_cast<uint_type>(fraction << 1);  // eat the leading 1
    fraction &= HF::fraction_represent_mask;
  }

  uint_type fraction_nibbles = HF::fraction_nibbles;
  // We do not have to display any trailing 0s, since this represents the
  // fractional part.
  while (fraction_nibbles > 0 && (fraction & 0xF) == 0) {
    // Shift off any trailing values;
    fraction = static_cast<uint_type>(fraction >> 4);
    --fraction_nibbles;
  }

  const auto saved_flags = os.flags();
  const auto saved_fill = os.fill();

  os << sign << "0x" << (is_zero ? '0' : '1');
  if (fraction_nibbles) {
    // Make sure to keep the leading 0s in place, since this is the fractional
    // part.
    os << "." << std::setw(static_cast<int>(fraction_nibbles))
       << std::setfill('0') << std::hex << fraction;
  }
  os << "p" << std::dec << (int_exponent >= 0 ? "+" : "") << int_exponent;

  os.flags(saved_flags);
  os.fill(saved_fill);

  return os;
}